

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 floatx80_rem_sparc(floatx80 a,floatx80 b,float_status *status)

{
  undefined1 auVar1 [12];
  uint32_t bLow;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ushort uVar11;
  ulong uVar12;
  ushort uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong zSig1;
  bool bVar21;
  floatx80 fVar22;
  
  uVar14 = b.low;
  uVar15 = a._8_8_;
  uVar2 = a.low;
  uVar13 = a.high & 0x7fff;
  if ((long)uVar2 < 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
  {
    uVar11 = b.high & 0x7fff;
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 ||
        (long)uVar14 < 0) {
      uVar5 = (uint)uVar13;
      if (uVar13 == 0x7fff) {
        if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0)
           && (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0
               || uVar11 != 0x7fff)) goto LAB_009cf7f1;
LAB_009cf86f:
        fVar22 = propagateFloatx80NaN_sparc(a,b,status);
        auVar1 = fVar22._0_12_;
      }
      else {
        if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
          if (uVar14 == 0) goto LAB_009cf7f1;
          uVar12 = 0x3f;
          if (uVar14 != 0) {
            for (; uVar14 >> uVar12 == 0; uVar12 = uVar12 - 1) {
            }
          }
          uVar14 = uVar14 << ((byte)(uVar12 ^ 0x3f) & 0x3f);
          uVar9 = 1 - (int)(uVar12 ^ 0x3f);
        }
        else {
          uVar9 = (uint)uVar11;
          if (uVar11 == 0x7fff) {
            if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) ==
                (undefined1  [16])0x0) goto LAB_009cf804;
            goto LAB_009cf86f;
          }
        }
        uVar12 = uVar2;
        if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
          if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0)
          goto LAB_009cf804;
          if (uVar2 == 0) {
            uVar5 = 0x40;
          }
          else {
            lVar7 = 0x3f;
            if (uVar2 != 0) {
              for (; uVar2 >> lVar7 == 0; lVar7 = lVar7 + -1) {
              }
            }
            uVar5 = (uint)lVar7 ^ 0x3f;
          }
          uVar12 = uVar2 << ((byte)uVar5 & 0x3f);
          uVar5 = 1 - uVar5;
        }
        uVar8 = uVar14 | 0x8000000000000000;
        uVar5 = uVar5 - uVar9;
        if ((int)uVar5 < 0) {
          if (uVar5 != 0xffffffff) goto LAB_009cf804;
          uVar2 = uVar12 >> 1;
          zSig1 = uVar12 << 0x3f;
          iVar16 = -0x40;
          uVar14 = 0;
          uVar5 = 0;
        }
        else {
          zSig1 = 0;
          uVar2 = 0;
          if (uVar8 <= uVar12) {
            uVar2 = uVar8;
          }
          uVar2 = uVar12 - uVar2;
          iVar16 = uVar5 - 0x40;
          if (uVar5 < 0x41) {
            uVar12 = (ulong)(uVar8 <= uVar12);
          }
          else {
            uVar19 = uVar8 >> 0x20;
            uVar3 = uVar14 & 0xffffffff00000000 | 0x8000000000000000;
            zSig1 = 0;
            iVar18 = iVar16;
            do {
              uVar6 = 0xffffffffffffffff;
              if (uVar2 < uVar8) {
                uVar12 = 0xffffffff00000000;
                if (uVar2 < uVar3) {
                  uVar12 = uVar2 / uVar19 << 0x20;
                }
                uVar17 = (uVar12 >> 0x20) * (uVar14 & 0xffffffff);
                uVar10 = uVar12 * uVar8;
                uVar6 = zSig1 - uVar10;
                for (lVar7 = ((uVar2 - ((uVar17 >> 0x20) + uVar19 * (uVar12 >> 0x20))) -
                             (ulong)(zSig1 < uVar10)) - (ulong)(uVar10 < uVar17 << 0x20); lVar7 < 0;
                    lVar7 = lVar7 + uVar19 + (ulong)bVar21) {
                  uVar12 = uVar12 - 0x100000000;
                  bVar21 = CARRY8(uVar6,uVar14 << 0x20);
                  uVar6 = uVar6 + (uVar14 << 0x20);
                }
                uVar10 = uVar6 >> 0x20 | lVar7 << 0x20;
                uVar6 = 0xffffffff;
                if (uVar10 < uVar3) {
                  uVar6 = uVar10 / uVar19;
                }
                uVar6 = uVar6 | uVar12;
              }
              uVar12 = 0;
              if (1 < uVar6) {
                uVar12 = uVar6 - 2;
              }
              lVar7 = (uVar12 & 0xffffffff) * uVar19 + (uVar12 >> 0x20) * (uVar14 & 0xffffffff);
              uVar6 = uVar12 * uVar8;
              uVar2 = (ulong)((((int)uVar2 - (uint)(zSig1 < uVar6)) -
                              ((int)((ulong)lVar7 >> 0x20) +
                              (int)(uVar12 >> 0x20) * (int)(uVar8 >> 0x20))) -
                             (uint)(uVar6 < (ulong)(lVar7 << 0x20))) << 0x3e | zSig1 + -uVar6 >> 2;
              zSig1 = -uVar6 << 0x3e;
              iVar16 = iVar18 + -0x3e;
              bVar21 = 0x3e < iVar18;
              iVar18 = iVar16;
            } while (bVar21);
          }
          uVar5 = (uint)uVar12;
          if (iVar16 < -0x3f) {
            uVar14 = 0;
          }
          else {
            uVar12 = uVar8 >> 0x20;
            if (uVar2 < uVar8) {
              uVar19 = uVar14 & 0xffffffff00000000 | 0x8000000000000000;
              uVar6 = 0xffffffff00000000;
              if (uVar2 < uVar19) {
                uVar6 = uVar2 / uVar12 << 0x20;
              }
              uVar17 = (uVar6 >> 0x20) * (uVar14 & 0xffffffff);
              uVar10 = uVar6 * uVar8;
              uVar3 = zSig1 - uVar10;
              lVar7 = ((uVar2 - ((uVar17 >> 0x20) + (uVar6 >> 0x20) * uVar12)) -
                      (ulong)(zSig1 < uVar10)) - (ulong)(uVar10 < uVar17 << 0x20);
              if (lVar7 < 0) {
                do {
                  uVar6 = uVar6 - 0x100000000;
                  bVar21 = CARRY8(uVar3,uVar14 << 0x20);
                  uVar3 = uVar3 + (uVar14 << 0x20);
                  lVar7 = lVar7 + uVar12 + (ulong)bVar21;
                } while (lVar7 < 0);
              }
              uVar10 = uVar3 >> 0x20 | lVar7 << 0x20;
              uVar3 = 0xffffffff;
              if (uVar10 < uVar19) {
                uVar3 = uVar10 / uVar12;
              }
              uVar3 = uVar3 | uVar6;
            }
            else {
              uVar3 = 0xffffffffffffffff;
            }
            uVar6 = 0;
            uVar19 = uVar3 - 2;
            if (uVar3 < 2) {
              uVar19 = uVar6;
            }
            bVar4 = -(byte)iVar16;
            uVar19 = uVar19 >> (bVar4 & 0x3f);
            uVar20 = uVar19 << (bVar4 & 0x3f);
            uVar3 = (uVar14 & 0xffffffff) * (uVar20 >> 0x20);
            uVar10 = (uVar20 & 0xffffffff) * uVar12;
            uVar17 = uVar10 + uVar3;
            uVar14 = 0xffffffff00000000;
            if (!CARRY8(uVar10,uVar3)) {
              uVar14 = uVar6;
            }
            uVar3 = uVar20 * uVar8;
            bVar21 = zSig1 < uVar3;
            zSig1 = zSig1 - uVar3;
            uVar2 = (((uVar2 - bVar21) - ((uVar17 >> 0x20) + (uVar20 >> 0x20) * uVar12)) + uVar14) -
                    (ulong)(uVar3 < uVar17 << 0x20);
            uVar14 = uVar8 << (bVar4 & 0x3f);
            uVar8 = uVar8 >> ((byte)iVar16 & 0x3f);
            if (iVar16 == 0) {
              uVar8 = uVar6;
            }
            if ((uVar8 < uVar2) || (uVar8 == uVar2 && uVar14 <= zSig1)) {
              do {
                do {
                  uVar19 = uVar19 + 1;
                  uVar12 = zSig1 - uVar14;
                  bVar21 = zSig1 < uVar14;
                  zSig1 = zSig1 - uVar14;
                  uVar2 = (uVar2 - uVar8) - (ulong)bVar21;
                } while (uVar8 < uVar2);
              } while (uVar8 == uVar2 && uVar14 <= uVar12);
            }
            uVar5 = (uint)uVar19;
          }
        }
        bVar4 = (byte)((uVar15 & 0xffff) >> 0xf);
        uVar15 = uVar14 - zSig1;
        uVar14 = (uVar8 - uVar2) - (ulong)(uVar14 < zSig1);
        if (((uVar14 < uVar2) || (uVar15 < zSig1 && uVar14 == uVar2)) ||
           ((uVar15 == zSig1 && ((uVar14 == uVar2 && ((uVar5 & 1) != 0)))))) {
          bVar4 = bVar4 ^ 1;
          uVar2 = uVar14;
          zSig1 = uVar15;
        }
        fVar22 = normalizeRoundAndPackFloatx80_sparc
                           ('P',bVar4,iVar16 + uVar9 + 0x40,uVar2,zSig1,status);
        auVar1 = fVar22._0_12_;
      }
      uVar2 = auVar1._0_8_;
      uVar15 = (ulong)auVar1._8_4_;
      goto LAB_009cf804;
    }
  }
LAB_009cf7f1:
  uVar2 = 0xc000000000000000;
  status->float_exception_flags = status->float_exception_flags | 1;
  uVar15 = CONCAT62(a._10_6_,0xffff);
LAB_009cf804:
  fVar22._8_8_ = uVar15 & 0xffffffff;
  fVar22.low = uVar2;
  return fVar22;
}

Assistant:

floatx80 floatx80_rem(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, zSign;
    int32_t aExp, bExp, expDiff;
    uint64_t aSig0, aSig1, bSig;
    uint64_t q, term0, term1, alternateASig0, alternateASig1;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig0 = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    if ( aExp == 0x7FFF ) {
        if (    (uint64_t) ( aSig0<<1 )
             || ( ( bExp == 0x7FFF ) && (uint64_t) ( bSig<<1 ) ) ) {
            return propagateFloatx80NaN(a, b, status);
        }
        goto invalid;
    }
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return floatx80_default_nan(status);
        }
        normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( (uint64_t) ( aSig0<<1 ) == 0 ) return a;
        normalizeFloatx80Subnormal( aSig0, &aExp, &aSig0 );
    }
    bSig |= UINT64_C(0x8000000000000000);
    zSign = aSign;
    expDiff = aExp - bExp;
    aSig1 = 0;
    if ( expDiff < 0 ) {
        if ( expDiff < -1 ) return a;
        shift128Right( aSig0, 0, 1, &aSig0, &aSig1 );
        expDiff = 0;
    }
    q = ( bSig <= aSig0 );
    if ( q ) aSig0 -= bSig;
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
        mul64To128( bSig, q, &term0, &term1 );
        sub128( aSig0, aSig1, term0, term1, &aSig0, &aSig1 );
        shortShift128Left( aSig0, aSig1, 62, &aSig0, &aSig1 );
        expDiff -= 62;
    }
    expDiff += 64;
    if ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
        q >>= 64 - expDiff;
        mul64To128( bSig, q<<( 64 - expDiff ), &term0, &term1 );
        sub128( aSig0, aSig1, term0, term1, &aSig0, &aSig1 );
        shortShift128Left( 0, bSig, 64 - expDiff, &term0, &term1 );
        while ( le128( term0, term1, aSig0, aSig1 ) ) {
            ++q;
            sub128( aSig0, aSig1, term0, term1, &aSig0, &aSig1 );
        }
    }
    else {
        term1 = 0;
        term0 = bSig;
    }
    sub128( term0, term1, aSig0, aSig1, &alternateASig0, &alternateASig1 );
    if (    lt128( alternateASig0, alternateASig1, aSig0, aSig1 )
         || (    eq128( alternateASig0, alternateASig1, aSig0, aSig1 )
              && ( q & 1 ) )
       ) {
        aSig0 = alternateASig0;
        aSig1 = alternateASig1;
        zSign = ! zSign;
    }
    return
        normalizeRoundAndPackFloatx80(
            80, zSign, bExp + expDiff, aSig0, aSig1, status);

}